

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O1

bool __thiscall cmake::Open(cmake *this,string *dir,bool dryRun)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  cmState *pcVar3;
  pointer pcVar4;
  bool bVar5;
  int iVar6;
  char *pcVar7;
  string *psVar8;
  size_t sVar9;
  cmGlobalGenerator *pcVar10;
  ostream *poVar11;
  undefined1 uVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  string fullName;
  string cachePath;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  paVar1 = &local_70.field_2;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  SetHomeDirectory(this,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  SetHomeOutputDirectory(this,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  bVar5 = cmsys::SystemTools::FileIsDirectory(dir);
  if (!bVar5) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error: ",7);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,(dir->_M_dataplus)._M_p,dir->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11," is not a directory\n",0x14);
    return false;
  }
  FindCacheFile(&local_70,dir);
  bVar5 = LoadCache(this,&local_70);
  if (bVar5) {
    pcVar3 = this->State;
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"CMAKE_GENERATOR","");
    pcVar7 = cmState::GetCacheEntryValue(pcVar3,&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if (pcVar7 != (char *)0x0) {
      pcVar3 = this->State;
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b0,"CMAKE_EXTRA_GENERATOR","");
      psVar8 = cmState::GetInitializedCacheValue(pcVar3,&local_b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      sVar9 = strlen(pcVar7);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,pcVar7,pcVar7 + sVar9);
      paVar2 = &local_50.field_2;
      local_50._M_dataplus._M_p = (pointer)paVar2;
      if (psVar8 == (string *)0x0) {
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
      }
      else {
        pcVar4 = (psVar8->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,pcVar4,pcVar4 + psVar8->_M_string_length);
      }
      paVar13 = &local_90.field_2;
      cmExternalMakefileProjectGenerator::CreateFullGeneratorName(&local_b0,&local_90,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != paVar2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != paVar13) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      pcVar10 = CreateGlobalGenerator(this,&local_b0);
      if (pcVar10 == (cmGlobalGenerator *)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Error: could create CMAKE_GENERATOR \"",0x25);
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,local_b0._M_dataplus._M_p,
                             local_b0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\"\n",2);
LAB_0028313b:
        uVar12 = 0;
      }
      else {
        pcVar3 = this->State;
        local_90._M_dataplus._M_p = (pointer)paVar13;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"CMAKE_PROJECT_NAME","")
        ;
        pcVar7 = cmState::GetCacheEntryValue(pcVar3,&local_90);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != paVar13) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        if (pcVar7 == (char *)0x0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error: could not find CMAKE_PROJECT_NAME in Cache\n",
                     0x32);
          goto LAB_0028313b;
        }
        local_90._M_dataplus._M_p = (pointer)paVar13;
        sVar9 = strlen(pcVar7);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,pcVar7,pcVar7 + sVar9);
        iVar6 = (*pcVar10->_vptr_cmGlobalGenerator[0x10])(pcVar10,dir,&local_90,(ulong)dryRun);
        uVar12 = (undefined1)iVar6;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
      }
      if (pcVar10 != (cmGlobalGenerator *)0x0) {
        (*pcVar10->_vptr_cmGlobalGenerator[1])(pcVar10);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      goto LAB_00283167;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Error: could not find CMAKE_GENERATOR in Cache\n",0x2f);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Error: could not load cache\n",0x1c);
  }
  uVar12 = 0;
LAB_00283167:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return (bool)uVar12;
}

Assistant:

bool cmake::Open(const std::string& dir, bool dryRun)
{
  this->SetHomeDirectory("");
  this->SetHomeOutputDirectory("");
  if (!cmSystemTools::FileIsDirectory(dir)) {
    std::cerr << "Error: " << dir << " is not a directory\n";
    return false;
  }

  std::string cachePath = FindCacheFile(dir);
  if (!this->LoadCache(cachePath)) {
    std::cerr << "Error: could not load cache\n";
    return false;
  }
  const char* genName = this->State->GetCacheEntryValue("CMAKE_GENERATOR");
  if (!genName) {
    std::cerr << "Error: could not find CMAKE_GENERATOR in Cache\n";
    return false;
  }
  const std::string* extraGenName =
    this->State->GetInitializedCacheValue("CMAKE_EXTRA_GENERATOR");
  std::string fullName =
    cmExternalMakefileProjectGenerator::CreateFullGeneratorName(
      genName, extraGenName ? *extraGenName : "");

  std::unique_ptr<cmGlobalGenerator> gen(
    this->CreateGlobalGenerator(fullName));
  if (!gen) {
    std::cerr << "Error: could create CMAKE_GENERATOR \"" << fullName
              << "\"\n";
    return false;
  }

  const char* cachedProjectName =
    this->State->GetCacheEntryValue("CMAKE_PROJECT_NAME");
  if (!cachedProjectName) {
    std::cerr << "Error: could not find CMAKE_PROJECT_NAME in Cache\n";
    return false;
  }

  return gen->Open(dir, cachedProjectName, dryRun);
}